

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::eval_leftShiftVecScalar_ivec3(ShaderEvalContext *c)

{
  float *pfVar1;
  VecAccess<float,_4,_3> local_58;
  undefined1 local_40 [24];
  _anonymous_namespace_ local_28 [12];
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_40,(int)c + 0x30,2,0);
  tcu::Vector<float,_3>::asInt((Vector<float,_3> *)(local_40 + 0xc));
  pfVar1 = tcu::Vector<float,_4>::x(local_10->in + 1);
  sr::(anonymous_namespace)::leftShiftVecScalar<int,3>
            (local_28,(Vector<int,_3> *)(local_40 + 0xc),(int)*pfVar1);
  tcu::Vector<int,_3>::asFloat((Vector<int,_3> *)&local_1c);
  tcu::Vector<float,_4>::xyz(&local_58,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_58,&local_1c);
  return;
}

Assistant:

void eval_selection_int		(ShaderEvalContext& c) { c.color.x()	= (float)selection(c.in[0].z() > 0.0f,	(int)c.in[1].x(),						(int)c.in[2].y()); }